

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileTimeCache.cxx
# Opt level: O0

bool __thiscall cmFileTimeCache::DifferS(cmFileTimeCache *this,string *f1,string *f2)

{
  bool bVar1;
  cmFileTime local_38;
  cmFileTime ft2;
  cmFileTime ft1;
  string *f2_local;
  string *f1_local;
  cmFileTimeCache *this_local;
  
  cmFileTime::cmFileTime(&ft2);
  cmFileTime::cmFileTime(&local_38);
  bVar1 = Load(this,f1,&ft2);
  if ((bVar1) && (bVar1 = Load(this,f2,&local_38), bVar1)) {
    this_local._7_1_ = cmFileTime::DifferS(&ft2,&local_38);
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool cmFileTimeCache::DifferS(std::string const& f1, std::string const& f2)
{
  // Get the modification time for each file.
  cmFileTime ft1, ft2;
  if (this->Load(f1, ft1) && this->Load(f2, ft2)) {
    // Compare the two modification times.
    return ft1.DifferS(ft2);
  }
  // No comparison available.  Default to different times.
  return true;
}